

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O3

int pfb_type(int chipset)

{
  int iVar1;
  
  iVar1 = 1;
  if ((((2 < chipset) && (iVar1 = 2, 0xf < (uint)chipset)) &&
      (iVar1 = 3, chipset != 0x34 && 0x19 < (uint)chipset)) && (iVar1 = 0, 0x1f < (uint)chipset)) {
    iVar1 = 4;
    if ((((0x3f < (uint)chipset) && (iVar1 = 5, chipset != 0x40)) && (chipset != 0x45)) &&
       ((((0x4b < (uint)chipset || (chipset == 0x4a)) ||
         (iVar1 = 6, (chipset & 0x7ffffffdU) == 0x44)) &&
        (iVar1 = 7, chipset == 0x50 || 0x7f < (uint)chipset)))) {
      iVar1 = 9 - (uint)((uint)chipset < 0xc0);
    }
  }
  return iVar1;
}

Assistant:

int pfb_type(int chipset) {
	if (chipset <3)
		return PFB_NV01;
	if (chipset < 0x10)
		return PFB_NV03;
	if (chipset < 0x1a || chipset == 0x34)
		return PFB_NV10;
	if (chipset < 0x20)
		return PFB_NONE; /* IGP */
	if (chipset < 0x40)
		return PFB_NV20;
	if (chipset == 0x40 || chipset == 0x45)
		return PFB_NV40;
	if (chipset != 0x44 && chipset != 0x46 && chipset != 0x4a && chipset < 0x4c)
		return PFB_NV41;
	if (chipset != 0x50 && chipset < 0x80)
		return PFB_NV44;
	if (chipset < 0xc0)
		return PFB_NV50;
	return PFB_NVC0;
}